

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                   (AssertionResult *assertion_result,char *expression_text,
                   char *actual_predicate_value,char *expected_predicate_value)

{
  char *pcVar1;
  Message *this;
  string *in_RDI;
  Message msg;
  char *actual_message;
  char (*in_stack_ffffffffffffff68) [12];
  AssertionResult *in_stack_ffffffffffffff70;
  Message *in_stack_ffffffffffffff78;
  
  pcVar1 = AssertionResult::message(in_stack_ffffffffffffff70);
  Message::Message((Message *)in_RDI);
  Message::operator<<((Message *)in_stack_ffffffffffffff70,(char (*) [11])in_stack_ffffffffffffff68)
  ;
  Message::operator<<((Message *)in_stack_ffffffffffffff70,(char **)in_stack_ffffffffffffff68);
  Message::operator<<((Message *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Message::operator<<((Message *)in_stack_ffffffffffffff70,(char **)in_stack_ffffffffffffff68);
  if (*pcVar1 != '\0') {
    Message::operator<<((Message *)in_stack_ffffffffffffff70,(char (*) [3])in_stack_ffffffffffffff68
                       );
    in_stack_ffffffffffffff78 =
         Message::operator<<((Message *)in_stack_ffffffffffffff70,(char **)in_stack_ffffffffffffff68
                            );
    Message::operator<<((Message *)in_stack_ffffffffffffff70,(char (*) [2])in_stack_ffffffffffffff68
                       );
  }
  this = Message::operator<<((Message *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Message::operator<<(this,(char **)in_stack_ffffffffffffff68);
  Message::GetString_abi_cxx11_(in_stack_ffffffffffffff78);
  Message::~Message((Message *)0x11a62f);
  return in_RDI;
}

Assistant:

std::string GetBoolAssertionFailureMessage(
    const AssertionResult& assertion_result, const char* expression_text,
    const char* actual_predicate_value, const char* expected_predicate_value) {
  const char* actual_message = assertion_result.message();
  Message msg;
  msg << "Value of: " << expression_text
      << "\n  Actual: " << actual_predicate_value;
  if (actual_message[0] != '\0') msg << " (" << actual_message << ")";
  msg << "\nExpected: " << expected_predicate_value;
  return msg.GetString();
}